

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FileDescriptorTables *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_06;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_07;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_08;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_09;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_10;
  Symbol SVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  Type TVar4;
  CppType CVar5;
  int iVar6;
  int iVar7;
  OneofDescriptor *pOVar8;
  FieldOptions *this_01;
  string *psVar9;
  LogMessage *pLVar10;
  once_flag *this_02;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  EnumDescriptor *pEVar15;
  EnumDescriptor *pEVar16;
  EnumValueDescriptor *pEVar17;
  Descriptor *pDVar18;
  FieldDescriptor *this_03;
  reference ppVar19;
  type_conflict1 *ptVar20;
  AlphaNum *pAVar21;
  AlphaNum *b;
  string_view sVar22;
  iterator iVar23;
  byte local_5bb;
  bool local_5ba;
  bool local_5b9;
  undefined8 local_588 [2];
  string_view local_578;
  undefined1 local_568 [8];
  anon_class_16_2_f7c7e1e7 make_error;
  undefined8 local_538 [2];
  string_view local_528;
  byte local_512;
  allocator<char> local_511;
  AlphaNum local_510;
  AlphaNum local_4e0;
  undefined1 local_4b0 [8];
  string proposed_message;
  type_conflict1 *end;
  type_conflict1 *start;
  long local_478;
  AlphaNum *local_470;
  int local_468;
  undefined1 local_460 [8];
  iterator __end4;
  undefined1 local_440 [8];
  iterator __begin4;
  btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  *__range4;
  int64_t proposed_number;
  long local_408;
  pair<long,_long> local_400;
  ReservedRange *local_3f0;
  ReservedRange *range_1;
  undefined1 local_3e0 [4];
  int i_2;
  long local_3c8;
  int local_3bc;
  pair<long,_long> local_3b8;
  ExtensionRange *local_3a8;
  ExtensionRange *range;
  undefined1 local_398 [4];
  int i_1;
  pair<long,_long> local_380;
  int local_370;
  int local_36c;
  int n;
  int i;
  Descriptor *parent;
  btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  fields_used;
  undefined8 local_330 [2];
  string_view local_320;
  undefined1 local_310 [8];
  string_view containing_type_name;
  FieldDescriptor *conflicting_field;
  anon_class_16_2_a4d50617 local_2d8;
  undefined8 local_2c8 [2];
  string_view local_2b8;
  string_view local_2a8;
  string_view local_298;
  Symbol local_288;
  EnumValueDescriptor *local_280;
  EnumValueDescriptor *default_value;
  anon_class_8_1_a879b908 local_268;
  undefined8 local_260 [2];
  string_view local_250;
  string_view local_240;
  anon_class_8_1_a879b908 local_230;
  undefined8 local_228 [2];
  string_view local_218;
  anon_class_8_1_a879b908 local_208;
  undefined8 local_200 [2];
  string_view local_1f0;
  anon_class_16_2_3fee0b3d local_1e0;
  undefined8 local_1d0 [2];
  string_view local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  string_view local_190;
  SymbolBase *local_180;
  void *local_178;
  char *names;
  string *psStack_168;
  int name_sizes;
  string *name;
  byte local_149;
  LogMessage local_148;
  Voidify local_131;
  string_view local_130;
  string_view local_120;
  Symbol local_110;
  Symbol type;
  bool is_lazy;
  bool is_weak;
  bool expecting_enum;
  anon_class_8_1_a7e8901a local_f0;
  undefined8 local_e8 [2];
  string_view local_d8;
  ExtensionRange *local_c8;
  ExtensionRange *extension_range;
  DescriptorBuilder *local_b8;
  undefined8 local_b0 [2];
  string_view local_a0;
  anon_class_8_1_a879b908 local_90;
  undefined8 local_88 [2];
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  undefined1 local_28 [8];
  Symbol extendee;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  extendee.ptr_ = (SymbolBase *)proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar2 = FieldDescriptorProto::has_extendee(proto);
  if (bVar2) {
    bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
    if (bVar2) {
      psVar9 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
      local_38 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
      local_48 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      local_28 = (undefined1  [8])
                 LookupSymbol(this,local_38,local_48,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true)
      ;
      bVar2 = Symbol::IsNull((Symbol *)local_28);
      if (bVar2) {
        local_58 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        psVar9 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        local_68 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
        AddNotDefinedError(this,local_58,(Message *)SVar1.ptr_,EXTENDEE,local_68);
        return;
      }
      TVar4 = Symbol::type((Symbol *)local_28);
      if (TVar4 != MESSAGE) {
        local_78 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        local_90.proto = (FieldDescriptorProto *)extendee.ptr_;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)local_88,&local_90);
        make_error_00.invoker_._0_4_ = (int)local_88[1];
        make_error_00.ptr_ = (VoidPtr)local_88[0];
        make_error_00.invoker_._4_4_ = (int)((ulong)local_88[1] >> 0x20);
        AddError(this,local_78,(Message *)SVar1.ptr_,EXTENDEE,make_error_00);
        return;
      }
      bVar2 = Symbol::IsVisibleFrom((Symbol *)local_28,this->file_);
      if (!bVar2) {
        local_a0 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        extension_range = (ExtensionRange *)local_28;
        local_b8 = this;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__1,void>
                  ((FunctionRef<std::__cxx11::string()> *)local_b0,
                   (anon_class_16_2_884784bd *)&extension_range);
        make_error_01.invoker_._0_4_ = (int)local_b0[1];
        make_error_01.ptr_ = (VoidPtr)local_b0[0];
        make_error_01.invoker_._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
        AddError(this,local_a0,(Message *)SVar1.ptr_,EXTENDEE,make_error_01);
        return;
      }
      pDVar18 = Symbol::descriptor((Symbol *)local_28);
      (proto_local->field_0)._impl_.extendee_.tagged_ptr_.ptr_ = pDVar18;
      pDVar18 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      iVar6 = FieldDescriptor::number((FieldDescriptor *)proto_local);
      local_c8 = Descriptor::FindExtensionRangeContainingNumber(pDVar18,iVar6);
      if (local_c8 == (ExtensionRange *)0x0) {
        local_d8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        local_f0.field = (FieldDescriptor **)&proto_local;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__2,void>
                  ((FunctionRef<std::__cxx11::string()> *)local_e8,&local_f0);
        make_error_02.invoker_._0_4_ = (int)local_e8[1];
        make_error_02.ptr_ = (VoidPtr)local_e8[0];
        make_error_02.invoker_._4_4_ = (int)((ulong)local_e8[1] >> 0x20);
        AddError(this,local_d8,(Message *)SVar1.ptr_,NUMBER,make_error_02);
      }
    }
  }
  pOVar8 = FieldDescriptor::containing_oneof((FieldDescriptor *)proto_local);
  if ((pOVar8 != (OneofDescriptor *)0x0) &&
     (*(byte *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 1) >> 6 !=
      1)) {
    sVar22 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,sVar22,(Message *)extendee.ptr_,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  bVar2 = FieldDescriptorProto::has_type_name((FieldDescriptorProto *)extendee.ptr_);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)extendee.ptr_);
    local_5b9 = true;
    if (FVar3 != FieldDescriptorProto_Type_TYPE_ENUM) {
      local_5b9 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)extendee.ptr_);
    }
    type.ptr_._7_1_ = local_5b9;
    local_5ba = false;
    if ((this->pool_->enforce_weak_ & 1U) == 0) {
      this_01 = FieldDescriptorProto::options((FieldDescriptorProto *)extendee.ptr_);
      local_5ba = FieldOptions::weak(this_01);
    }
    type.ptr_._6_1_ = local_5ba;
    local_5bb = 0;
    if ((this->pool_->lazily_build_dependencies_ & 1U) != 0) {
      local_5bb = local_5ba ^ 0xff;
    }
    type.ptr_._5_1_ = local_5bb & 1;
    psVar9 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
    local_120 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
    local_130 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    local_110 = LookupSymbol(this,local_120,local_130,(uint)((type.ptr_._7_1_ & 1) != 0),
                             LOOKUP_TYPES,(bool)((type.ptr_._5_1_ ^ 0xff) & 1));
    bVar2 = Symbol::IsNull(&local_110);
    if (bVar2) {
      if ((type.ptr_._5_1_ & 1) != 0) {
        local_149 = 0;
        bVar2 = true;
        if ((*(char *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 2)
             != '\v') &&
           (bVar2 = true,
           *(char *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 2) !=
           '\n')) {
          bVar2 = *(char *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite
                           + 2) == '\x0e';
        }
        if (!bVar2) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_148,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1eb7,
                     "field->type_ == FieldDescriptor::TYPE_MESSAGE || field->type_ == FieldDescriptor::TYPE_GROUP || field->type_ == FieldDescriptor::TYPE_ENUM"
                    );
          local_149 = 1;
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
          pLVar10 = absl::lts_20250127::log_internal::LogMessage::
                    operator<<<google::protobuf::FieldDescriptorProto,_0>
                              (pLVar10,(FieldDescriptorProto *)extendee.ptr_);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar10);
        }
        if ((local_149 & 1) == 0) {
          psStack_168 = FieldDescriptorProto::type_name_abi_cxx11_
                                  ((FieldDescriptorProto *)extendee.ptr_);
          iVar7 = std::__cxx11::string::size();
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
          iVar6 = std::__cxx11::string::size();
          iVar6 = iVar7 + 1 + iVar6;
          names._4_4_ = iVar6 + 1;
          this_02 = (once_flag *)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 + 5);
          absl::lts_20250127::once_flag::once_flag(this_02);
          *(once_flag **)((long)&proto_local->field_0 + 8) = this_02;
          pvVar11 = (void *)((long)(proto_local->field_0)._impl_.name_.tagged_ptr_.ptr_ + 4);
          local_178 = pvVar11;
          pvVar12 = (void *)std::__cxx11::string::c_str();
          lVar13 = std::__cxx11::string::size();
          memcpy(pvVar11,pvVar12,lVar13 + 1);
          pvVar11 = local_178;
          lVar13 = std::__cxx11::string::size();
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
          pvVar12 = (void *)std::__cxx11::string::c_str();
          FieldDescriptorProto::default_value_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
          lVar14 = std::__cxx11::string::size();
          memcpy((void *)((long)pvVar11 + lVar13 + 1),pvVar12,lVar14 + 1);
          FileDescriptorTables::AddFieldByNumber(this->file_tables_,(FieldDescriptor *)proto_local);
          bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
          if (!bVar2) {
            return;
          }
          DescriptorPool::Tables::AddExtension(this->tables_,(FieldDescriptor *)proto_local);
          return;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_148);
      }
      if ((type.ptr_._6_1_ & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_190,"google.protobuf.Empty");
        local_180 = (SymbolBase *)FindSymbol(this,local_190,true);
        local_110 = (Symbol)local_180;
      }
      bVar2 = Symbol::IsNull(&local_110);
      if (bVar2) {
        local_1a0 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        psVar9 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        local_1b0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
        AddNotDefinedError(this,local_1a0,(Message *)SVar1.ptr_,TYPE,local_1b0);
        return;
      }
    }
    bVar2 = Symbol::IsVisibleFrom(&local_110,this->file_);
    if (!bVar2) {
      local_1c0 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      SVar1 = extendee;
      local_1e0.type = &local_110;
      local_1e0.this = this;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__3,void>
                ((FunctionRef<std::__cxx11::string()> *)local_1d0,&local_1e0);
      make_error_03.invoker_._0_4_ = (int)local_1d0[1];
      make_error_03.ptr_ = (VoidPtr)local_1d0[0];
      make_error_03.invoker_._4_4_ = (int)((ulong)local_1d0[1] >> 0x20);
      AddError(this,local_1c0,(Message *)SVar1.ptr_,TYPE,make_error_03);
      return;
    }
    bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)extendee.ptr_);
    if (!bVar2) {
      TVar4 = Symbol::type(&local_110);
      if (TVar4 == MESSAGE) {
        *(undefined1 *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 2)
             = 0xb;
      }
      else {
        TVar4 = Symbol::type(&local_110);
        if (TVar4 != ENUM) {
          local_1f0 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
          SVar1 = extendee;
          local_208.proto = (FieldDescriptorProto *)extendee.ptr_;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__4,void>
                    ((FunctionRef<std::__cxx11::string()> *)local_200,&local_208);
          make_error_04.invoker_._0_4_ = (int)local_200[1];
          make_error_04.ptr_ = (VoidPtr)local_200[0];
          make_error_04.invoker_._4_4_ = (int)((ulong)local_200[1] >> 0x20);
          AddError(this,local_1f0,(Message *)SVar1.ptr_,TYPE,make_error_04);
          return;
        }
        *(undefined1 *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 2)
             = 0xe;
      }
    }
    CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
    if (CVar5 == CPPTYPE_MESSAGE) {
      pDVar18 = Symbol::descriptor(&local_110);
      (proto_local->field_0)._impl_.default_value_.tagged_ptr_.ptr_ = pDVar18;
      if ((proto_local->field_0)._impl_.default_value_.tagged_ptr_.ptr_ == (void *)0x0) {
        local_218 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        local_230.proto = (FieldDescriptorProto *)extendee.ptr_;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__5,void>
                  ((FunctionRef<std::__cxx11::string()> *)local_228,&local_230);
        make_error_05.invoker_._0_4_ = (int)local_228[1];
        make_error_05.ptr_ = (VoidPtr)local_228[0];
        make_error_05.invoker_._4_4_ = (int)((ulong)local_228[1] >> 0x20);
        AddError(this,local_218,(Message *)SVar1.ptr_,TYPE,make_error_05);
        return;
      }
      bVar2 = FieldDescriptor::has_default_value((FieldDescriptor *)proto_local);
      if (bVar2) {
        local_240 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        AddError(this,local_240,(Message *)extendee.ptr_,DEFAULT_VALUE,
                 "Messages can\'t have default values.");
      }
    }
    else {
      CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
      if (CVar5 == CPPTYPE_ENUM) {
        pEVar15 = Symbol::enum_descriptor(&local_110);
        (proto_local->field_0)._impl_.default_value_.tagged_ptr_.ptr_ = pEVar15;
        if ((proto_local->field_0)._impl_.default_value_.tagged_ptr_.ptr_ == (void *)0x0) {
          local_250 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
          SVar1 = extendee;
          local_268.proto = (FieldDescriptorProto *)extendee.ptr_;
          absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__6,void>
                    ((FunctionRef<std::__cxx11::string()> *)local_260,&local_268);
          make_error_06.invoker_._0_4_ = (int)local_260[1];
          make_error_06.ptr_ = (VoidPtr)local_260[0];
          make_error_06.invoker_._4_4_ = (int)((ulong)local_260[1] >> 0x20);
          AddError(this,local_250,(Message *)SVar1.ptr_,TYPE,make_error_06);
          return;
        }
        pEVar15 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
        if ((pEVar15->field_0x1 & 1) != 0) {
          *(byte *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 1) =
               *(byte *)((long)&(proto_local->super_Message).super_MessageLite._vptr_MessageLite + 1
                        ) & 0xfe;
        }
        bVar2 = FieldDescriptor::has_default_value((FieldDescriptor *)proto_local);
        if (bVar2) {
          psVar9 = FieldDescriptorProto::default_value_abi_cxx11_
                             ((FieldDescriptorProto *)extendee.ptr_);
          bVar2 = io::Tokenizer::IsIdentifier(psVar9);
          if (bVar2) {
            psVar9 = FieldDescriptorProto::default_value_abi_cxx11_
                               ((FieldDescriptorProto *)extendee.ptr_);
            local_298 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9);
            pEVar15 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
            local_2a8 = EnumDescriptor::full_name(pEVar15);
            local_288 = LookupSymbolNoPlaceholder(this,local_298,local_2a8,LOOKUP_ALL,true);
            local_280 = Symbol::enum_value_descriptor(&local_288);
            if (local_280 != (EnumValueDescriptor *)0x0) {
              pEVar15 = EnumValueDescriptor::type(local_280);
              pEVar16 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
              if (pEVar15 == pEVar16) {
                *(EnumValueDescriptor **)((long)&proto_local->field_0 + 0x40) = local_280;
                goto LAB_002fe6c7;
              }
            }
            local_2b8 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
            SVar1 = extendee;
            local_2d8.field = (FieldDescriptor **)&proto_local;
            local_2d8.proto = (FieldDescriptorProto *)extendee.ptr_;
            absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
            FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__7,void>
                      ((FunctionRef<std::__cxx11::string()> *)local_2c8,&local_2d8);
            make_error_07.invoker_._0_4_ = (int)local_2c8[1];
            make_error_07.ptr_ = (VoidPtr)local_2c8[0];
            make_error_07.invoker_._4_4_ = (int)((ulong)local_2c8[1] >> 0x20);
            AddError(this,local_2b8,(Message *)SVar1.ptr_,DEFAULT_VALUE,make_error_07);
          }
          else {
            _default_value = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
            AddError(this,_default_value,(Message *)extendee.ptr_,DEFAULT_VALUE,
                     "Default value for an enum field must be an identifier.");
          }
        }
        else {
          pEVar15 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
          iVar6 = EnumDescriptor::value_count(pEVar15);
          if (0 < iVar6) {
            pEVar15 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
            pEVar17 = EnumDescriptor::value(pEVar15,0);
            *(EnumValueDescriptor **)((long)&proto_local->field_0 + 0x40) = pEVar17;
          }
        }
      }
      else {
        sVar22 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        AddError(this,sVar22,(Message *)extendee.ptr_,TYPE,
                 "Field with primitive type has type_name.");
      }
    }
  }
  else {
    CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
    if (CVar5 != CPPTYPE_MESSAGE) {
      CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
      if (CVar5 != CPPTYPE_ENUM) goto LAB_002fe6c7;
    }
    sVar22 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,sVar22,(Message *)extendee.ptr_,TYPE,
             "Field with message or enum type missing type_name.");
  }
LAB_002fe6c7:
  bVar2 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,(FieldDescriptor *)proto_local);
  if (bVar2) {
    bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
    if (bVar2) {
      bVar2 = DescriptorPool::Tables::AddExtension(this->tables_,(FieldDescriptor *)proto_local);
      if (!bVar2) {
        make_error.this = (DescriptorBuilder *)&proto_local;
        local_568 = (undefined1  [8])this;
        local_578 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
        SVar1 = extendee;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__10,void>
                  ((FunctionRef<std::__cxx11::string()> *)local_588,
                   (anon_class_16_2_f7c7e1e7 *)local_568);
        make_error_10.invoker_._0_4_ = (int)local_588[1];
        make_error_10.ptr_ = (VoidPtr)local_588[0];
        make_error_10.invoker_._4_4_ = (int)((ulong)local_588[1] >> 0x20);
        AddWarning(this,local_578,(Message *)SVar1.ptr_,NUMBER,make_error_10);
      }
    }
  }
  else {
    this_00 = this->file_tables_;
    pDVar18 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    iVar6 = FieldDescriptor::number((FieldDescriptor *)proto_local);
    containing_type_name._M_str =
         (char *)FileDescriptorTables::FindFieldByNumber(this_00,pDVar18,iVar6);
    pDVar18 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    if (pDVar18 == (Descriptor *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_310,"unknown");
    }
    else {
      pDVar18 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      _local_310 = Descriptor::full_name(pDVar18);
    }
    bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
    if (bVar2) {
      local_320 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      SVar1 = extendee;
      fields_used.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .tree_.size_ = (size_type)&proto_local;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__8,void>
                ((FunctionRef<std::__cxx11::string()> *)local_330,
                 (anon_class_24_3_fb42f32f *)
                 &fields_used.
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                  .
                  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                  .tree_.size_);
      make_error_08.invoker_._0_4_ = (int)local_330[1];
      make_error_08.ptr_ = (VoidPtr)local_330[0];
      make_error_08.invoker_._4_4_ = (int)((ulong)local_330[1] >> 0x20);
      AddError(this,local_320,(Message *)SVar1.ptr_,NUMBER,make_error_08);
    }
    else {
      absl::lts_20250127::
      btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
      ::btree_set((btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                   *)&parent);
      _n = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      local_36c = 0;
      while( true ) {
        iVar6 = local_36c;
        iVar7 = Descriptor::field_count(_n);
        if (iVar7 <= iVar6) break;
        this_03 = Descriptor::field(_n,local_36c);
        local_370 = FieldDescriptor::number(this_03);
        std::pair<long,_long>::pair<int_&,_int_&,_true>(&local_380,&local_370,&local_370);
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)local_398,
                 (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                  *)&parent,&local_380);
        local_36c = local_36c + 1;
      }
      range._4_4_ = 0;
      while( true ) {
        iVar6 = range._4_4_;
        iVar7 = Descriptor::extension_range_count(_n);
        if (iVar7 <= iVar6) break;
        local_3a8 = Descriptor::extension_range(_n,range._4_4_);
        local_3bc = Descriptor::ExtensionRange::start_number(local_3a8);
        iVar6 = Descriptor::ExtensionRange::end_number(local_3a8);
        local_3c8 = (long)iVar6 + -1;
        std::pair<long,_long>::pair<int,_long,_true>(&local_3b8,&local_3bc,&local_3c8);
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)local_3e0,
                 (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                  *)&parent,&local_3b8);
        range._4_4_ = range._4_4_ + 1;
      }
      range_1._4_4_ = 0;
      while( true ) {
        iVar6 = range_1._4_4_;
        iVar7 = Descriptor::reserved_range_count(_n);
        if (iVar7 <= iVar6) break;
        local_3f0 = Descriptor::reserved_range(_n,range_1._4_4_);
        local_408 = (long)local_3f0->end + -1;
        std::pair<long,_long>::pair<const_int_&,_long,_true>
                  (&local_400,&local_3f0->start,&local_408);
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)&proposed_number,
                 (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                  *)&parent,&local_400);
        range_1._4_4_ = range_1._4_4_ + 1;
      }
      __range4 = (btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                  *)0x1;
      __begin4._8_8_ = &parent;
      iVar23 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
               ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                        *)__begin4._8_8_);
      __end4._8_8_ = iVar23.node_;
      __begin4.node_._0_4_ = iVar23.position_;
      local_440 = (undefined1  [8])__end4._8_8_;
      iVar23 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
               ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                      *)__begin4._8_8_);
      pAVar21 = (AlphaNum *)iVar23.node_;
      local_468 = iVar23.position_;
      local_470 = pAVar21;
      local_460 = (undefined1  [8])pAVar21;
      __end4.node_._0_4_ = local_468;
      while( true ) {
        bVar2 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                              *)local_440,(iterator *)local_460);
        b = pAVar21;
        if (!bVar2) break;
        ppVar19 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                               *)local_440);
        b = (AlphaNum *)ppVar19->first;
        local_478 = ppVar19->second;
        start = (type_conflict1 *)b;
        ptVar20 = std::get<0ul,long,long>((pair<long,_long> *)&start);
        pAVar21 = (AlphaNum *)std::get<1ul,long,long>((pair<long,_long> *)&start);
        proposed_message.field_2._8_8_ = pAVar21;
        if (((long)__range4 < *ptVar20) ||
           (b = pAVar21, (long)(pAVar21->piece_)._M_len < (long)__range4)) break;
        __range4 = (btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                    *)((pAVar21->piece_)._M_len + 1);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                      *)local_440);
      }
      local_512 = 0;
      if ((long)__range4 < 0x20000000) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_4e0,"Next available field number is ");
        absl::lts_20250127::AlphaNum::AlphaNum(&local_510,(long)__range4);
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_4b0,(lts_20250127 *)&local_4e0,&local_510,b);
      }
      else {
        std::allocator<char>::allocator();
        local_512 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4b0,"There are no available field numbers",&local_511);
      }
      if ((local_512 & 1) != 0) {
        std::allocator<char>::~allocator(&local_511);
      }
      local_528 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      SVar1 = extendee;
      make_error.field = (FieldDescriptor **)&proto_local;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__9,void>
                ((FunctionRef<std::__cxx11::string()> *)local_538,
                 (anon_class_32_4_caa787f7 *)&make_error.field);
      make_error_09.invoker_._0_4_ = (int)local_538[1];
      make_error_09.ptr_ = (VoidPtr)local_538[0];
      make_error_09.invoker_._4_4_ = (int)((ulong)local_538[1] >> 0x20);
      AddError(this,local_528,(Message *)SVar1.ptr_,NUMBER,make_error_09);
      std::__cxx11::string::~string((string *)local_4b0);
      absl::lts_20250127::
      btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
      ::~btree_set((btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                    *)&parent);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (proto.has_extendee() && field->is_extension()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::StrCat("\"", proto.extendee(),
                                     "\" is not a message type.");
               });
      return;
    } else if (!extendee.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return extendee.GetVisibilityError(file_, "target of extend");
               });
      return;
    }

    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "\"$0\" does not declare $1 as an "
                     "extension number.",
                     field->containing_type()->full_name(), field->number());
               });
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label_ != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        ABSL_CHECK(field->type_ == FieldDescriptor::TYPE_MESSAGE ||
                   field->type_ == FieldDescriptor::TYPE_GROUP ||
                   field->type_ == FieldDescriptor::TYPE_ENUM)
            << proto;
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        const std::string& name = proto.type_name();

        int name_sizes = static_cast<int>(name.size() + 1 +
                                          proto.default_value().size() + 1);

        field->type_once_ = ::new (tables_->AllocateBytes(
            static_cast<int>(sizeof(absl::once_flag)) + name_sizes))
            absl::once_flag{};
        char* names = reinterpret_cast<char*>(field->type_once_ + 1);

        memcpy(names, name.c_str(), name.size() + 1);
        memcpy(names + name.size() + 1, proto.default_value().c_str(),
               proto.default_value().size() + 1);

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!type.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               [&] { return type.GetVisibilityError(file_); });
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a type.");
                 });
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a message type.");
                 });
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not an enum type.");
                 });
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                       return absl::StrCat("Enum type \"",
                                           field->enum_type()->full_name(),
                                           "\" has no value named \"",
                                           proto.default_value(), "\".");
                     });
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    const absl::string_view containing_type_name =
        field->containing_type() == nullptr
            ? absl::string_view("unknown")
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension number $0 has already been used "
                     "in \"$1\" by extension \"$2\".",
                     field->number(), containing_type_name,
                     conflicting_field->full_name());
               });
    } else {
      absl::btree_set<std::pair<int64_t, int64_t>> fields_used;
      auto* parent = field->containing_type();
      for (int i = 0; i < parent->field_count(); ++i) {
        int n = parent->field(i)->number();
        fields_used.insert({n, n});
      }
      for (int i = 0; i < parent->extension_range_count(); ++i) {
        auto* range = parent->extension_range(i);
        fields_used.insert({range->start_number(),
                            static_cast<int64_t>(range->end_number()) - 1});
      }
      for (int i = 0; i < parent->reserved_range_count(); ++i) {
        auto* range = parent->reserved_range(i);
        fields_used.insert(
            {range->start, static_cast<int64_t>(range->end) - 1});
      }
      int64_t proposed_number = 1;
      for (auto [start, end] : fields_used) {
        if (start <= proposed_number && proposed_number <= end) {
          proposed_number = end + 1;
        } else {
          break;
        }
      }

      const std::string proposed_message =
          proposed_number <= FieldDescriptor::kMaxNumber
              ? absl::StrCat("Next available field number is ", proposed_number)
              : "There are no available field numbers";

      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Field number $0 has already been used in "
                     "\"$1\" by field \"$2\". $3.",
                     field->number(), containing_type_name,
                     conflicting_field->name(), proposed_message);
               });
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        auto make_error = [&] {
          const FieldDescriptor* conflicting_field =
              tables_->FindExtension(field->containing_type(), field->number());
          const absl::string_view containing_type_name =
              field->containing_type() == nullptr
                  ? absl::string_view("unknown")
                  : field->containing_type()->full_name();
          return absl::Substitute(
              "Extension number $0 has already been used in \"$1\" by "
              "extension "
              "\"$2\" defined in $3.",
              field->number(), containing_type_name,
              conflicting_field->full_name(),
              conflicting_field->file()->name());
        };
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO: Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
      }

    }
  }
}